

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

void __thiscall IsoWriter::writeFileSetDescriptor(IsoWriter *this)

{
  uint8_t *buffer;
  int iVar1;
  ulong uVar2;
  uint8_t *puVar3;
  size_t in_RCX;
  uint32_t *buff32;
  ByteFileWriter local_48;
  
  buffer = this->m_buffer;
  memset(buffer,0,0x800);
  local_48.m_bufferEnd = (uint8_t *)&this->m_currentTime;
  uVar2 = (this->m_file).m_pos;
  iVar1 = this->m_tagLocationBaseAddr;
  this->m_buffer[0] = '\0';
  this->m_buffer[1] = '\x01';
  this->m_buffer[2] = '\x03';
  this->m_buffer[3] = '\0';
  this->m_buffer[6] = '\x01';
  this->m_buffer[7] = '\0';
  *(int *)(this->m_buffer + 0xc) = (int)(uVar2 >> 0xb) - iVar1;
  local_48.m_buffer = buffer;
  local_48.m_tagPos = buffer;
  anon_unknown.dwarf_cd2a3::writeTimestamp(this->m_buffer + 0x10,this->m_currentTime);
  this->m_buffer[0x1c] = '\x03';
  this->m_buffer[0x1d] = '\0';
  this->m_buffer[0x1e] = '\x03';
  this->m_buffer[0x1f] = '\0';
  this->m_buffer[0x20] = '\x01';
  this->m_buffer[0x21] = '\0';
  this->m_buffer[0x22] = '\0';
  this->m_buffer[0x23] = '\0';
  this->m_buffer[0x24] = '\x01';
  this->m_buffer[0x25] = '\0';
  this->m_buffer[0x26] = '\0';
  this->m_buffer[0x27] = '\0';
  this->m_buffer[0x28] = '\0';
  this->m_buffer[0x29] = '\0';
  this->m_buffer[0x2a] = '\0';
  this->m_buffer[0x2b] = '\0';
  this->m_buffer[0x2c] = '\0';
  this->m_buffer[0x2d] = '\0';
  this->m_buffer[0x2e] = '\0';
  this->m_buffer[0x2f] = '\0';
  this->m_buffer[0x41] = 'U';
  this->m_buffer[0x42] = 'n';
  this->m_buffer[0x43] = 'i';
  this->m_buffer[0x44] = 'c';
  this->m_buffer[0x45] = 'o';
  this->m_buffer[0x46] = 'd';
  this->m_buffer[0x47] = 'e';
  this->m_buffer[0x48] = '\0';
  this->m_buffer[0x31] = 'O';
  this->m_buffer[0x32] = 'S';
  this->m_buffer[0x33] = 'T';
  this->m_buffer[0x34] = 'A';
  this->m_buffer[0x35] = ' ';
  this->m_buffer[0x36] = 'C';
  this->m_buffer[0x37] = 'o';
  this->m_buffer[0x38] = 'm';
  this->m_buffer[0x39] = 'p';
  this->m_buffer[0x3a] = 'r';
  this->m_buffer[0x3b] = 'e';
  this->m_buffer[0x3c] = 's';
  this->m_buffer[0x3d] = 's';
  this->m_buffer[0x3e] = 'e';
  this->m_buffer[0x3f] = 'd';
  this->m_buffer[0x40] = ' ';
  local_48.m_curPos = this->m_buffer + 0x70;
  ByteFileWriter::writeDString(&local_48,&this->m_volumeLabel,0x80);
  builtin_memcpy(local_48.m_curPos + 1,"OSTA Compressed Unicode",0x18);
  local_48.m_curPos = local_48.m_curPos + 0x40;
  ByteFileWriter::writeDString(&local_48,&this->m_volumeLabel,0x20);
  puVar3 = local_48.m_curPos;
  puVar3[0x40] = '\0';
  puVar3[0x41] = '\b';
  puVar3[0x42] = '\0';
  puVar3[0x43] = '\0';
  puVar3[0x44] = '\x02';
  puVar3[0x45] = '\0';
  puVar3[0x46] = '\0';
  puVar3[0x47] = '\0';
  puVar3[0x48] = '\x01';
  puVar3[0x49] = '\0';
  puVar3[0x4c] = '\0';
  puVar3[0x4d] = '\0';
  puVar3[0x4e] = '\0';
  puVar3[0x4f] = '\0';
  anon_unknown.dwarf_cd2a3::writeUDFString(local_48.m_curPos + 0x50,"*OSTA UDF Compliant",0x20);
  this->m_buffer[0x1ba] = '\x03';
  puVar3[0x70] = '\0';
  puVar3[0x71] = '\0';
  puVar3[0x72] = '\0';
  puVar3[0x73] = '\0';
  puVar3[0x74] = '\0';
  puVar3[0x75] = '\0';
  puVar3[0x76] = '\0';
  puVar3[0x77] = '\0';
  puVar3[0x78] = '\0';
  puVar3[0x79] = '\0';
  puVar3[0x7c] = '\0';
  puVar3[0x7d] = '\0';
  puVar3[0x7e] = '\0';
  puVar3[0x7f] = '\0';
  iVar1 = this->m_systemStreamLBN;
  puVar3[0x80] = '\0';
  puVar3[0x81] = '\b';
  puVar3[0x82] = '\0';
  puVar3[0x83] = '\0';
  *(int *)(puVar3 + 0x84) = iVar1;
  puVar3[0x88] = '\x01';
  puVar3[0x89] = '\0';
  puVar3[0x8c] = '\0';
  puVar3[0x8d] = '\0';
  puVar3[0x8e] = '\0';
  puVar3[0x8f] = '\0';
  anon_unknown.dwarf_cd2a3::calcDescriptorCRC(buffer,0x200);
  File::write(&this->m_file,(int)buffer,(void *)0x800,in_RCX);
  return;
}

Assistant:

void IsoWriter::writeFileSetDescriptor()
{
    memset(m_buffer, 0, sizeof(m_buffer));

    ByteFileWriter writer;
    writer.setBuffer(m_buffer, sizeof(m_buffer));
    writer.writeDescriptorTag(DescriptorTag::FileSet, absoluteSectorNum());

    writer.writeTimestamp(m_currentTime);  // Recording Date and Time
    writer.writeLE16(0x03);                // Interchange Level
    writer.writeLE16(0x03);                // Maximum Interchange Level
    writer.writeLE32(0x01);                // Character Set List
    writer.writeLE32(0x01);                // Maximum Character Set List
    writer.writeLE32(0x00);                // File Set Number
    writer.writeLE32(0x00);                // File Set Descriptor Number
    writer.writeCharSpecString("OSTA Compressed Unicode", 64);
    writer.writeDString(m_volumeLabel, 128);                    // Logical Volume Identifier
    writer.writeCharSpecString("OSTA Compressed Unicode", 64);  // File Set Character Set
    writer.writeDString(m_volumeLabel, 32);                     // File Set Identifier
    writer.skipBytes(32);                                       // Copyright File Identifier
    writer.skipBytes(32);                                       // Abstract File Identifier
    writer.writeLongAD(0x0800, 2, 1, 0);                        // Root Directory ICB
    writer.writeUDFString("*OSTA UDF Compliant", 32);           // Domain Identifier
    m_buffer[442] = 0x03;                                       // Domain Flags: Hard and Soft Write-Protect
    writer.writeLongAD(0, 0, 0, 0);                             // Next Extent
    writer.writeLongAD(0x0800, m_systemStreamLBN, 1, 0);

    calcDescriptorCRC(m_buffer, 512);
    m_file.write(m_buffer, SECTOR_SIZE);
}